

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffered_stream.c
# Opt level: O1

cio_error cio_buffered_stream_read_until
                    (cio_buffered_stream *buffered_stream,cio_read_buffer *buffer,char *delim,
                    cio_buffered_stream_read_handler_t handler,void *handler_context)

{
  size_t sVar1;
  cio_error cVar2;
  
  cVar2 = CIO_INVALID_ARGUMENT;
  if ((((delim != (char *)0x0) && (buffered_stream != (cio_buffered_stream *)0x0)) &&
      (buffer != (cio_read_buffer *)0x0)) && (handler != (cio_buffered_stream_read_handler_t)0x0)) {
    (buffered_stream->read_info).until.delim = delim;
    sVar1 = strlen(delim);
    (buffered_stream->read_info).until.delim_length = sVar1;
    buffered_stream->read_job = internal_read_until;
    buffered_stream->read_buffer = buffer;
    buffered_stream->read_handler = handler;
    buffered_stream->read_handler_context = handler_context;
    buffered_stream->last_error = CIO_SUCCESS;
    cVar2 = CIO_SUCCESS;
    if (buffered_stream->callback_is_running == 0) {
      run_read(buffered_stream);
    }
  }
  return cVar2;
}

Assistant:

enum cio_error cio_buffered_stream_read_until(struct cio_buffered_stream *buffered_stream, struct cio_read_buffer *buffer, const char *delim, cio_buffered_stream_read_handler_t handler, void *handler_context)
{
	if (cio_unlikely((buffered_stream == NULL) || (buffer == NULL) || (handler == NULL) || (delim == NULL))) {
		return CIO_INVALID_ARGUMENT;
	}

	buffered_stream->read_info.until.delim = delim;
	buffered_stream->read_info.until.delim_length = strlen(delim);
	buffered_stream->read_job = internal_read_until;
	buffered_stream->read_buffer = buffer;
	buffered_stream->read_handler = handler;
	buffered_stream->read_handler_context = handler_context;
	buffered_stream->last_error = CIO_SUCCESS;
	start_read(buffered_stream);

	return CIO_SUCCESS;
}